

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dict.c
# Opt level: O3

xmlDictPtr xmlDictCreate(void)

{
  int iVar1;
  xmlDictPtr pxVar2;
  _xmlDictEntry *__s;
  
  if (((xmlDictInitialized != '\0') || (iVar1 = __xmlInitializeDict(), iVar1 != 0)) &&
     (pxVar2 = (xmlDictPtr)(*xmlMalloc)(0x40), pxVar2 != (xmlDictPtr)0x0)) {
    pxVar2->ref_counter = 1;
    pxVar2->limit = 0;
    pxVar2->size = 0x80;
    pxVar2->nbElems = 0;
    __s = (_xmlDictEntry *)(*xmlMalloc)(0x1000);
    pxVar2->dict = __s;
    pxVar2->strings = (xmlDictStringsPtr_conflict)0x0;
    pxVar2->subdict = (_xmlDict *)0x0;
    if (__s != (_xmlDictEntry *)0x0) {
      memset(__s,0,0x1000);
      iVar1 = __xmlRandom();
      pxVar2->seed = iVar1;
      return pxVar2;
    }
    (*xmlFree)(pxVar2);
  }
  return (xmlDictPtr)0x0;
}

Assistant:

xmlDictPtr
xmlDictCreate(void) {
    xmlDictPtr dict;

    if (!xmlDictInitialized)
        if (!__xmlInitializeDict())
            return(NULL);

#ifdef DICT_DEBUG_PATTERNS
    fprintf(stderr, "C");
#endif

    dict = xmlMalloc(sizeof(xmlDict));
    if (dict) {
        dict->ref_counter = 1;
        dict->limit = 0;

        dict->size = MIN_DICT_SIZE;
	dict->nbElems = 0;
        dict->dict = xmlMalloc(MIN_DICT_SIZE * sizeof(xmlDictEntry));
	dict->strings = NULL;
	dict->subdict = NULL;
        if (dict->dict) {
	    memset(dict->dict, 0, MIN_DICT_SIZE * sizeof(xmlDictEntry));
#ifdef DICT_RANDOMIZATION
            dict->seed = __xmlRandom();
#else
            dict->seed = 0;
#endif
	    return(dict);
        }
        xmlFree(dict);
    }
    return(NULL);
}